

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O2

void __thiscall
prevector_tests::prevector_tester<8U,_int>::resize_uninitialized
          (prevector_tester<8U,_int> *this,realtype values)

{
  pretype *this_00;
  ulong __n;
  uint uVar1;
  pointer piVar2;
  value_type_conflict2 *pvVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  pretype *ppVar6;
  value_type_conflict2 *pvVar7;
  long *in_RSI;
  uint uVar8;
  ulong __new_size;
  long lVar9;
  long in_FS_OFFSET;
  value_type_conflict2 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = in_RSI[1] - *in_RSI >> 2;
  piVar2 = (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __new_size = (ulong)((long)(this->real_vector).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2) >> 1;
  __n = lVar9 + __new_size;
  if ((ulong)((long)(this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage - (long)piVar2 >> 2) < __n) {
    std::vector<int,_std::allocator<int>_>::reserve(&this->real_vector,__n);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->real_vector,__new_size);
  this_00 = &this->pre_vector;
  prevector<8U,_int,_unsigned_int,_int>::resize_uninitialized(this_00,(size_type)__new_size);
  pvVar3 = (value_type_conflict2 *)in_RSI[1];
  for (pvVar7 = (value_type_conflict2 *)*in_RSI; pvVar7 != pvVar3; pvVar7 = pvVar7 + 1) {
    local_3c = *pvVar7;
    std::vector<int,_std::allocator<int>_>::push_back(&this->real_vector,&local_3c);
  }
  uVar1 = (this->pre_vector)._size;
  uVar8 = uVar1 - 9;
  if (uVar1 < 9) {
    uVar8 = uVar1;
  }
  prevector<8U,_int,_unsigned_int,_int>::resize_uninitialized(this_00,(int)lVar9 + uVar8);
  puVar4 = (undefined4 *)in_RSI[1];
  for (puVar5 = (undefined4 *)*in_RSI; puVar5 != puVar4; puVar5 = puVar5 + 1) {
    ppVar6 = this_00;
    if (8 < (this->pre_vector)._size) {
      ppVar6 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
    }
    *(undefined4 *)((long)&ppVar6->_union + (long)(int)uVar8 * 4) = *puVar5;
    uVar8 = uVar8 + 1;
  }
  test(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void resize_uninitialized(realtype values) {
        size_t r = values.size();
        size_t s = real_vector.size() / 2;
        if (real_vector.capacity() < s + r) {
            real_vector.reserve(s + r);
        }
        real_vector.resize(s);
        pre_vector.resize_uninitialized(s);
        for (auto v : values) {
            real_vector.push_back(v);
        }
        auto p = pre_vector.size();
        pre_vector.resize_uninitialized(p + r);
        for (auto v : values) {
            pre_vector[p] = v;
            ++p;
        }
        test();
    }